

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O3

wchar_t block_and_read(wchar_t fd,void *buf,size_t len)

{
  int iVar1;
  uint uVar2;
  wchar_t extraout_EAX;
  pollwrapper *pw;
  ssize_t sVar3;
  int *piVar4;
  undefined4 in_register_0000003c;
  
  pw = pollwrap_new();
  while ((sVar3 = read(0,(void *)CONCAT44(in_register_0000003c,fd),0x1f), (int)sVar3 < 0 &&
         (piVar4 = __errno_location(), *piVar4 == 0xb))) {
    pollwrap_clear(pw);
    pollwrap_add_fd_rwx(pw,0,1);
    while( true ) {
      iVar1 = pollwrap_poll_endless(pw);
      if (-1 < iVar1) break;
      if (*piVar4 != 4) goto LAB_00107734;
    }
    if (iVar1 == 0) {
      __assert_fail("ret != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/console.c"
                    ,0x5d,"int block_and_read(int, void *, size_t)");
    }
    uVar2 = pollwrap_get_fd_rwx(pw,0);
    if ((uVar2 & 1) == 0) {
      __assert_fail("pollwrap_check_fd_rwx(pw, fd, SELECT_R)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/console.c"
                    ,0x62,"int block_and_read(int, void *, size_t)");
    }
  }
LAB_00107734:
  pollwrap_free(pw);
  return extraout_EAX;
}

Assistant:

static int block_and_read(int fd, void *buf, size_t len)
{
    int ret;
    pollwrapper *pw = pollwrap_new();

    while ((ret = read(fd, buf, len)) < 0 && (
#ifdef EAGAIN
               (errno == EAGAIN) ||
#endif
#ifdef EWOULDBLOCK
               (errno == EWOULDBLOCK) ||
#endif
               false)) {

        pollwrap_clear(pw);
        pollwrap_add_fd_rwx(pw, fd, SELECT_R);
        do {
            ret = pollwrap_poll_endless(pw);
        } while (ret < 0 && errno == EINTR);
        assert(ret != 0);
        if (ret < 0) {
            pollwrap_free(pw);
            return ret;
        }
        assert(pollwrap_check_fd_rwx(pw, fd, SELECT_R));
    }

    pollwrap_free(pw);
    return ret;
}